

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * kwssys::SystemTools::RemoveChars(char *str,char *toremove)

{
  size_t sVar1;
  char *in_RSI;
  char *in_RDI;
  bool bVar2;
  char *str2;
  char *ptr;
  char *clean_str;
  char *local_30;
  char *local_28;
  char *local_10;
  char *local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    sVar1 = strlen(in_RDI);
    local_8 = (char *)operator_new__(sVar1 + 1);
    local_28 = local_8;
    for (local_10 = in_RDI; local_30 = in_RSI, *local_10 != '\0'; local_10 = local_10 + 1) {
      while( true ) {
        bVar2 = false;
        if (*local_30 != '\0') {
          bVar2 = *local_10 != *local_30;
        }
        if (!bVar2) break;
        local_30 = local_30 + 1;
      }
      if (*local_30 == '\0') {
        *local_28 = *local_10;
        local_28 = local_28 + 1;
      }
    }
    *local_28 = '\0';
  }
  return local_8;
}

Assistant:

char* SystemTools::RemoveChars(const char* str, const char* toremove)
{
  if (!str) {
    return nullptr;
  }
  char* clean_str = new char[strlen(str) + 1];
  char* ptr = clean_str;
  while (*str) {
    const char* str2 = toremove;
    while (*str2 && *str != *str2) {
      ++str2;
    }
    if (!*str2) {
      *ptr++ = *str;
    }
    ++str;
  }
  *ptr = '\0';
  return clean_str;
}